

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.c
# Opt level: O0

void add_test_to_context(TestSuite *parent,ContextSuite **context_suites,TestItem *test_item,
                        CgreenTest *test)

{
  ContextSuite *pCVar1;
  ContextSuite *in_RCX;
  ContextSuite *in_RDX;
  TestSuite *in_RSI;
  TestSuite *suite_for_context;
  TestSuite *local_28;
  
  local_28 = find_suite_for_context(in_RDX,(char *)in_RCX);
  if (local_28 == (TestSuite *)0x0) {
    pCVar1 = add_new_context_suite(in_RSI,(char *)in_RDX,in_RCX);
    in_RSI->name = (char *)pCVar1;
    local_28 = *(TestSuite **)(in_RSI->name + 8);
  }
  add_test_(local_28,in_RDX->next,in_RCX);
  return;
}

Assistant:

static void add_test_to_context(TestSuite *parent, ContextSuite **context_suites,
                                TestItem *test_item, CgreenTest *test) {
    TestSuite *suite_for_context = find_suite_for_context(*context_suites, test_item->context_name);

    if (suite_for_context == NULL) {
        *context_suites = add_new_context_suite(parent, test_item->context_name, *context_suites);
        suite_for_context = (*context_suites)->suite;
    }
    add_test_(suite_for_context, test_item->test_name, test);
}